

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O2

Stream * rw::readSkinLegacy(Stream *stream,int32 len,void *object,int32 param_4,int32 param_5)

{
  Frame *f;
  uint uVar1;
  int32 iVar2;
  Skin *this;
  HAnimHierarchy *pHVar3;
  ulong uVar4;
  HAnimData *pHVar5;
  long lVar6;
  long lVar7;
  Matrix mat;
  
  lVar7 = *(long *)((long)object + 0x28);
  uVar1 = Stream::readI32(stream);
  iVar2 = Stream::readI32(stream);
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/skin.cpp line: 265";
  this = (Skin *)(*DAT_00144da8)(0x70,0x30116);
  *(Skin **)(lVar7 + skinGlobals) = this;
  Skin::init(this,(EVP_PKEY_CTX *)(ulong)uVar1);
  this->legacyType = 1;
  this->numWeights = 4;
  (*stream->_vptr_Stream[4])(stream,this->indices,(ulong)(uint)(iVar2 * 4));
  Stream::read32(stream,this->weights,iVar2 << 4);
  lVar7 = 0;
  pHVar3 = HAnimHierarchy::create(uVar1,(int32 *)0x0,(int32 *)0x0,0,0x24);
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  for (lVar6 = 0; uVar4 * 0x18 - lVar6 != 0; lVar6 = lVar6 + 0x18) {
    iVar2 = Stream::readI32(stream);
    *(int32 *)((long)&pHVar3->nodeInfo->id + lVar6) = iVar2;
    iVar2 = Stream::readI32(stream);
    *(int32 *)((long)&pHVar3->nodeInfo->index + lVar6) = iVar2;
    uVar1 = Stream::readI32(stream);
    *(uint *)((long)&pHVar3->nodeInfo->flags + lVar6) = uVar1 & 3;
    Stream::read32(stream,(void *)((long)this->inverseMatrices + lVar7),0x40);
    Matrix::invert(&mat,(Matrix *)((long)this->inverseMatrices + lVar7));
    lVar7 = lVar7 + 0x40;
  }
  f = *(Frame **)(*(long *)((long)object + 8) + 0xb0);
  pHVar5 = HAnimData::get(f);
  pHVar5->hierarchy = pHVar3;
  pHVar3->parentFrame = f;
  return stream;
}

Assistant:

static Stream*
readSkinLegacy(Stream *stream, int32 len, void *object, int32, int32)
{
	Atomic *atomic = (Atomic*)object;
	Geometry *geometry = atomic->geometry;

	int32 numBones = stream->readI32();
	int32 numVertices = stream->readI32();
	assert(numVertices == geometry->numVertices);

	Skin *skin = rwNewT(Skin, 1, MEMDUR_EVENT | ID_SKIN);
	*PLUGINOFFSET(Skin*, geometry, skinGlobals.geoOffset) = skin;
	skin->init(numBones, numBones, numVertices);
	skin->legacyType = 1;
	skin->numWeights = 4;

	stream->read8(skin->indices, numVertices*4);
	stream->read32(skin->weights, numVertices*16);

	HAnimHierarchy *hier = HAnimHierarchy::create(numBones, nil, nil, 0, 36);

	for(int i = 0; i < numBones; i++){
		hier->nodeInfo[i].id = stream->readI32();
		hier->nodeInfo[i].index = stream->readI32();
		hier->nodeInfo[i].flags = stream->readI32() & 3;
//		printf("%d %d %d %d\n", i, hier->nodeInfo[i].id, hier->nodeInfo[i].index, hier->nodeInfo[i].flags);
		stream->read32(&skin->inverseMatrices[i*16], 64);

		Matrix mat;
		Matrix::invert(&mat, (Matrix*)&skin->inverseMatrices[i*16]);
//		printf("[ [ %8.4f, %8.4f, %8.4f, %8.4f ]\n"
//		       "  [ %8.4f, %8.4f, %8.4f, %8.4f ]\n"
//		       "  [ %8.4f, %8.4f, %8.4f, %8.4f ]\n"
//		       "  [ %8.4f, %8.4f, %8.4f, %8.4f ] ]\n"
//			"  %08x == flags\n",
//			mat.right.x, mat.up.x, mat.at.x, mat.pos.x,
//			mat.right.y, mat.up.y, mat.at.y, mat.pos.y,
//			mat.right.z, mat.up.z, mat.at.z, mat.pos.z,
//			0.0f, 0.0f, 0.0f, 1.0f,
//			mat.flags);
	}
	Frame *frame = atomic->getFrame()->child;
	assert(frame->next == nil);	// in old files atomic is above hierarchy it seems
	assert(frame->count() == numBones);	// assuming one frame per node this should also be true
	HAnimData::get(frame)->hierarchy = hier;
	hier->parentFrame = frame;

	return stream;
}